

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-attach-file.cc
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  long *plVar7;
  size_t sVar8;
  ostream *poVar9;
  undefined8 *puVar10;
  element_type *peVar11;
  long *extraout_RAX;
  undefined8 extraout_RAX_00;
  char *pcVar12;
  size_type *in_RCX;
  element_type *peVar13;
  long *plVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **pp_Var15;
  ulong *puVar16;
  int extraout_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_type *extraout_RDX_00;
  size_type *psVar17;
  ulong uVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  long lVar20;
  QPDFObjectHandle QVar21;
  QPDFObjectHandle QVar22;
  QPDFObjectHandle QVar23;
  QPDFObjectHandle QVar24;
  QPDFObjectHandle QVar25;
  QPDF q;
  size_type __dnew;
  QPDFFileSpecObjectHelper fs;
  string key;
  QPDFEmbeddedFileDocumentHelper efdh;
  QPDFObjectHandle page;
  QPDFObjectHandle apdict;
  QPDFObjectHandle contents;
  QPDFObjectHandle ap;
  QPDFObjectHandle annot;
  QPDFObjectHandle resources;
  QPDFObjectHandle f1;
  QPDFObjectHandle local_398;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_388;
  ulong uStack_380;
  QPDF local_378 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_370;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_368;
  long local_360;
  undefined8 uStack_358;
  undefined1 local_350 [62];
  allocator<char> local_312;
  allocator<char> local_311;
  long *local_310;
  undefined8 local_308;
  long local_300;
  undefined8 uStack_2f8;
  ulong *local_2f0;
  long local_2e8;
  ulong local_2e0;
  long lStack_2d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_2d0;
  long local_2c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2c0;
  long lStack_2b8;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_290;
  long local_288;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_280;
  long lStack_278;
  ulong *local_270;
  long local_268;
  ulong local_260;
  long lStack_258;
  undefined1 local_250 [32];
  char *local_230;
  undefined1 local_228 [16];
  element_type *local_218;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_210;
  element_type *local_1f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e0 [2];
  undefined1 *local_1d0;
  long local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0 [2];
  string local_190 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  ulong *local_160;
  long local_158;
  ulong local_150 [2];
  size_type local_140;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_138;
  long *local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  long local_120 [2];
  string local_110 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  string local_100 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  string local_f0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  QPDF local_e0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  element_type local_d0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  string local_c0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  QPDF local_b0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  element_type local_a0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  char local_90 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  element_type local_80 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  long *local_50 [2];
  long local_40 [2];
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if (argc < 2) {
LAB_00103ccf:
    local_350._0_8_ = local_350 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_350,"required arguments were not provided","");
    usage((string *)local_350);
    plVar7 = extraout_RAX;
    psVar17 = extraout_RDX_00;
LAB_00103cf9:
    local_350._16_8_ = *in_RCX;
    local_350._0_8_ = psVar17;
LAB_00103d06:
    local_350._8_8_ = plVar7[1];
    *plVar7 = (long)in_RCX;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    usage((string *)local_350);
    if (local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)argv) {
      operator_delete(local_398.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (long)local_388 + 1);
    }
    QPDFEFStreamObjectHelper::~QPDFEFStreamObjectHelper((QPDFEFStreamObjectHelper *)local_228);
    QPDFFileSpecObjectHelper::~QPDFFileSpecObjectHelper((QPDFFileSpecObjectHelper *)local_350);
    if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
      operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
    }
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
    }
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    }
    QPDF::~QPDF(local_378);
    if (extraout_EDX != 1) {
      _Unwind_Resume(extraout_RAX_00);
    }
    plVar7 = (long *)__cxa_begin_catch(extraout_RAX_00);
    poVar9 = std::operator<<((ostream *)&std::cerr,whoami);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," exception: ",0xc);
    pcVar12 = (char *)(**(code **)(*plVar7 + 0x10))(plVar7);
    poVar9 = std::operator<<(poVar9,pcVar12);
    std::endl<char,std::char_traits<char>>(poVar9);
    exit(2);
  }
  lVar20 = 1;
  local_168 = (char *)0x0;
  local_170 = (char *)0x0;
  local_180 = (char *)0x0;
  local_178 = (char *)0x0;
  local_230 = (char *)0x0;
  do {
    pcVar12 = argv[lVar20];
    pcVar2 = argv[lVar20 + 1];
    iVar6 = strcmp(pcVar12,"--infile");
    if (iVar6 == 0) {
      local_350._0_8_ = local_350 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_350,"--infile takes an argument","");
      if (pcVar2 == (char *)0x0) {
        usage((string *)local_350);
LAB_00103c4b:
        usage((string *)local_350);
LAB_00103c55:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_228,pcVar12,(allocator<char> *)local_250);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)local_228,0,(char *)0x0,0x1050ca);
        local_350._0_8_ = local_350 + 0x10;
        psVar17 = (size_type *)*plVar7;
        in_RCX = (size_type *)(plVar7 + 2);
        if (psVar17 != in_RCX) goto LAB_00103cf9;
        local_350._16_8_ = *in_RCX;
        local_350._24_8_ = plVar7[3];
        goto LAB_00103d06;
      }
      pcVar12 = local_230;
      pcVar3 = local_180;
      pcVar4 = local_178;
      pcVar5 = local_170;
      if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
        operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
        pcVar12 = local_230;
        pcVar3 = local_180;
        pcVar4 = local_178;
        pcVar5 = local_170;
      }
    }
    else {
      iVar6 = strcmp(pcVar12,"--password");
      if (iVar6 == 0) {
        local_350._0_8_ = local_350 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_350,"--password takes an argument","");
        if (pcVar2 == (char *)0x0) goto LAB_00103c4b;
        pcVar12 = local_230;
        pcVar3 = local_180;
        pcVar4 = local_178;
        pcVar5 = pcVar2;
        pcVar2 = local_168;
        if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
          operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
          pcVar12 = local_230;
          pcVar3 = local_180;
          pcVar4 = local_178;
          pcVar2 = local_168;
        }
      }
      else {
        iVar6 = strcmp(pcVar12,"--attachment");
        if (iVar6 == 0) {
          local_350._0_8_ = local_350 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_350,"--attachment takes an argument","");
          if (pcVar2 == (char *)0x0) {
LAB_00103cbb:
            usage((string *)local_350);
LAB_00103cc5:
            usage((string *)local_350);
            goto LAB_00103ccf;
          }
          pcVar12 = local_230;
          pcVar3 = pcVar2;
          pcVar4 = local_178;
          pcVar5 = local_170;
          pcVar2 = local_168;
          if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
            operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
            pcVar12 = local_230;
            pcVar4 = local_178;
            pcVar5 = local_170;
            pcVar2 = local_168;
          }
        }
        else {
          iVar6 = strcmp(pcVar12,"--outfile");
          if (iVar6 == 0) {
            local_350._0_8_ = local_350 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_350,"--outfile takes an argument","");
            if (pcVar2 == (char *)0x0) goto LAB_00103cc5;
            pcVar12 = pcVar2;
            pcVar3 = local_180;
            pcVar4 = local_178;
            pcVar5 = local_170;
            pcVar2 = local_168;
            if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
              operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
              pcVar3 = local_180;
              pcVar4 = local_178;
              pcVar5 = local_170;
              pcVar2 = local_168;
            }
          }
          else {
            iVar6 = strcmp(pcVar12,"--mimetype");
            if (iVar6 != 0) goto LAB_00103c55;
            local_350._0_8_ = local_350 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_350,"--mimetype takes an argument","");
            if (pcVar2 == (char *)0x0) {
              usage((string *)local_350);
              goto LAB_00103cbb;
            }
            pcVar12 = local_230;
            pcVar3 = local_180;
            pcVar4 = pcVar2;
            pcVar5 = local_170;
            pcVar2 = local_168;
            if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
              operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
              pcVar12 = local_230;
              pcVar3 = local_180;
              pcVar5 = local_170;
              pcVar2 = local_168;
            }
          }
        }
      }
    }
    local_168 = pcVar2;
    local_170 = pcVar5;
    local_178 = pcVar4;
    local_180 = pcVar3;
    local_230 = pcVar12;
    pcVar2 = local_168;
    pcVar12 = local_180;
    lVar20 = lVar20 + 2;
  } while ((int)lVar20 < argc);
  if (((local_168 == (char *)0x0) || (local_180 == (char *)0x0)) || (local_230 == (char *)0x0))
  goto LAB_00103ccf;
  QPDF::QPDF(local_378);
  pcVar1 = local_350 + 0x10;
  QPDF::processFile((char *)local_378,pcVar2);
  operator____qpdf(local_90,0x1051ae);
  QVar21.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_378;
  QVar21.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_80;
  QPDF::makeIndirectObject(QVar21);
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_250,0,(char *)0x0,0x10520e);
  peVar13 = (element_type *)(plVar7 + 2);
  if ((element_type *)*plVar7 == peVar13) {
    local_218 = *(element_type **)peVar13;
    _Stack_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[3];
    local_228._0_8_ = (element_type *)&local_218;
  }
  else {
    local_218 = *(element_type **)peVar13;
    local_228._0_8_ = (element_type *)*plVar7;
  }
  local_228._8_8_ = plVar7[1];
  *plVar7 = (long)peVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_228);
  plVar14 = plVar7 + 2;
  if ((long *)*plVar7 == plVar14) {
    local_350._16_8_ = *plVar14;
    local_350._24_8_ = plVar7[3];
    local_350._0_8_ = pcVar1;
  }
  else {
    local_350._16_8_ = *plVar14;
    local_350._0_8_ = (long *)*plVar7;
  }
  local_350._8_8_ = plVar7[1];
  *plVar7 = (long)plVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              ((ulong)local_388 & 0xffffffffffffff00);
  local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_388;
  QPDFObjectHandle::parse(local_b0,(string *)local_378,(string *)local_350);
  QVar22.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_378;
  QVar22.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_a0;
  QPDF::makeIndirectObject(QVar22);
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  if (local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)&local_388) {
    operator_delete(local_398.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (long)local_388 + 1);
  }
  if ((pointer)local_350._0_8_ != pcVar1) {
    operator_delete((void *)local_350._0_8_,(ulong)(local_350._16_8_ + 1));
  }
  if ((element_type *)local_228._0_8_ != (element_type *)&local_218) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_218 + 1));
  }
  if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
    operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_350,pcVar12,(allocator<char> *)local_228);
  QUtil::path_basename((string *)local_250);
  if ((pointer)local_350._0_8_ != pcVar1) {
    operator_delete((void *)local_350._0_8_,(ulong)(local_350._16_8_ + 1));
  }
  pcVar2 = whoami;
  if (whoami == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x108080);
  }
  else {
    sVar8 = strlen(whoami);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": attaching ",0xc);
  sVar8 = strlen(pcVar12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar12,sVar8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," as ",4);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_250._0_8_,local_250._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_228,pcVar12,(allocator<char> *)&local_398);
  QPDFFileSpecObjectHelper::createFileSpec
            ((QPDF *)local_350,(string *)local_378,(string *)local_250);
  if ((element_type *)local_228._0_8_ != (element_type *)&local_218) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_218 + 1));
  }
  pcVar2 = local_178;
  if (local_178 != (char *)0x0) {
    local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((ulong)local_388 & 0xffffffffffffff00);
    local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)&local_388;
    QPDFFileSpecObjectHelper::getEmbeddedFileStream(local_c0);
    QVar25.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    QVar25.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_c0;
    QPDFEFStreamObjectHelper::QPDFEFStreamObjectHelper((QPDFEFStreamObjectHelper *)local_228,QVar25)
    ;
    if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
    }
    if (local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)&local_388) {
      operator_delete(local_398.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (long)local_388 + 1);
    }
    local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)&local_388;
    sVar8 = strlen(pcVar2);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,pcVar2,pcVar2 + sVar8);
    QPDFEFStreamObjectHelper::setSubtype((string *)local_228);
    if (local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)&local_388) {
      operator_delete(local_398.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (long)local_388 + 1);
    }
    QPDFEFStreamObjectHelper::~QPDFEFStreamObjectHelper((QPDFEFStreamObjectHelper *)local_228);
  }
  QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper
            ((QPDFEmbeddedFileDocumentHelper *)local_228,local_378);
  QPDFEmbeddedFileDocumentHelper::replaceEmbeddedFile
            ((string *)local_228,(QPDFFileSpecObjectHelper *)local_250);
  local_370 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x34;
  local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_388;
  local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)std::__cxx11::string::_M_create((ulong *)&local_398,(ulong)&local_370);
  local_388 = local_370;
  *(undefined8 *)
   (local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   + 0x20) = 0x3020300a6c203032;
  *(undefined8 *)
   (local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   + 0x28) = 0x7220303220303220;
  *(undefined8 *)
   (local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   + 0x10) = 0x30310a6c20303120;
  *(undefined8 *)
   (local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   + 0x18) = 0x2030310a6d203020;
  *(undefined8 *)
   local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = 0x310a6d2030312030;
  *(undefined8 *)
   (local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   + 8) = 0x30320a6c20302030;
  *(undefined4 *)
   (local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   + 0x30) = 0xa530a65;
  local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_370;
  local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  [(long)local_370] = (element_type)0x0;
  QPDF::newStream(local_110);
  if (local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)&local_388) {
    operator_delete(local_398.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)(local_388 + 1));
  }
  QPDFObjectHandle::getDict();
  local_388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6372756f7365522f;
  local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa;
  uStack_380 = CONCAT53(uStack_380._3_5_,0x7365);
  local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_388;
  operator____qpdf((char *)&local_370,0x10527c);
  QPDFObjectHandle::replaceKey(local_190,&local_398);
  if (local_368 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368);
  }
  if (local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)&local_388) {
    operator_delete(local_398.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (long)local_388 + 1);
  }
  local_388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT26(local_388._6_2_,0x657079542f)
  ;
  local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x5;
  local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_388;
  operator____qpdf((char *)&local_370,0x105288);
  QPDFObjectHandle::replaceKey(local_190,&local_398);
  if (local_368 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368);
  }
  if (local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)&local_388) {
    operator_delete(local_398.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (long)local_388 + 1);
  }
  local_388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x657079746275532f;
  local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x8;
  uStack_380 = uStack_380 & 0xffffffffffffff00;
  local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_388;
  operator____qpdf((char *)&local_370,0x105291);
  QPDFObjectHandle::replaceKey(local_190,&local_398);
  if (local_368 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368);
  }
  if (local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)&local_388) {
    operator_delete(local_398.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (long)local_388 + 1);
  }
  local_388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT26(local_388._6_2_,0x786f42422f)
  ;
  local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x5;
  local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_388;
  operator____qpdf((char *)&local_370,0x10529d);
  QPDFObjectHandle::replaceKey(local_190,&local_398);
  if (local_368 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368);
  }
  if (local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)&local_388) {
    operator_delete(local_398.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (long)local_388 + 1);
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,0x1052ab);
  pp_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(plVar7 + 2);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*plVar7 == pp_Var15) {
    local_280 = *pp_Var15;
    lStack_278 = plVar7[3];
    local_290 = &local_280;
  }
  else {
    local_280 = *pp_Var15;
    local_290 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*plVar7;
  }
  local_288 = plVar7[1];
  *plVar7 = (long)pp_Var15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_290);
  puVar16 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar16) {
    local_260 = *puVar16;
    lStack_258 = plVar7[3];
    local_270 = &local_260;
  }
  else {
    local_260 = *puVar16;
    local_270 = (ulong *)*plVar7;
  }
  local_268 = plVar7[1];
  *plVar7 = (long)puVar16;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,pcVar12,&local_311);
  QPDFObjectHandle::newUnicodeString(local_f0);
  QPDFObjectHandle::unparse_abi_cxx11_();
  uVar18 = 0xf;
  if (local_270 != &local_260) {
    uVar18 = local_260;
  }
  if (uVar18 < (ulong)(local_1c8 + local_268)) {
    uVar18 = 0xf;
    if (local_1d0 != &local_1c0) {
      uVar18 = CONCAT71(uStack_1bf,local_1c0);
    }
    if (uVar18 < (ulong)(local_1c8 + local_268)) goto LAB_00102f76;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_270);
  }
  else {
LAB_00102f76:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_1d0);
  }
  local_2b0 = &local_2a0;
  plVar7 = puVar10 + 2;
  if ((long *)*puVar10 == plVar7) {
    local_2a0 = *plVar7;
    lStack_298 = puVar10[3];
  }
  else {
    local_2a0 = *plVar7;
    local_2b0 = (long *)*puVar10;
  }
  local_2a8 = puVar10[1];
  *puVar10 = plVar7;
  puVar10[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  pp_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(plVar7 + 2);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*plVar7 == pp_Var15) {
    local_2c0 = *pp_Var15;
    lStack_2b8 = plVar7[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *pp_Var15;
    local_2d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*plVar7;
  }
  local_2c8 = plVar7[1];
  *plVar7 = (long)pp_Var15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_140 = local_350._8_8_;
  local_138 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_350._16_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_350._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_350._16_8_ + 8) = *(int *)(local_350._16_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_350._16_8_ + 8) = *(int *)(local_350._16_8_ + 8) + 1;
    }
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
  if (local_2d0 != &local_2c0) {
    p_Var19 = local_2c0;
  }
  if (p_Var19 < local_1e8 + local_2c8) {
    p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
    if (local_1f0 != (element_type *)local_1e0) {
      p_Var19 = local_1e0[0];
    }
    if (p_Var19 < local_1e8 + local_2c8) goto LAB_001030f3;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_2d0);
  }
  else {
LAB_001030f3:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_1f0);
  }
  local_310 = &local_300;
  plVar7 = puVar10 + 2;
  if ((long *)*puVar10 == plVar7) {
    local_300 = *plVar7;
    uStack_2f8 = puVar10[3];
  }
  else {
    local_300 = *plVar7;
    local_310 = (long *)*puVar10;
  }
  local_308 = puVar10[1];
  *puVar10 = plVar7;
  puVar10[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_310);
  puVar16 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar16) {
    local_2e0 = *puVar16;
    lStack_2d8 = plVar7[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar16;
    local_2f0 = (ulong *)*plVar7;
  }
  local_2e8 = plVar7[1];
  *plVar7 = (long)puVar16;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,pcVar12,&local_312);
  QPDFObjectHandle::newUnicodeString(local_100);
  QPDFObjectHandle::unparse_abi_cxx11_();
  uVar18 = 0xf;
  if (local_2f0 != &local_2e0) {
    uVar18 = local_2e0;
  }
  if (uVar18 < (ulong)(local_158 + local_2e8)) {
    uVar18 = 0xf;
    if (local_160 != local_150) {
      uVar18 = local_150[0];
    }
    if (uVar18 < (ulong)(local_158 + local_2e8)) goto LAB_00103268;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_160,0,(char *)0x0,(ulong)local_2f0);
  }
  else {
LAB_00103268:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_160);
  }
  local_370 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_360;
  p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(puVar10 + 2);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar10 == p_Var19) {
    local_360 = *(long *)p_Var19;
    uStack_358 = puVar10[3];
  }
  else {
    local_360 = *(long *)p_Var19;
    local_370 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar10;
  }
  local_368 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar10[1];
  *puVar10 = p_Var19;
  puVar10[1] = 0;
  *p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)0x0;
  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
  peVar11 = (element_type *)(puVar10 + 2);
  if ((element_type *)*puVar10 == peVar11) {
    local_388 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)peVar11;
    uStack_380 = puVar10[3];
    local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)&local_388;
  }
  else {
    local_388 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)peVar11;
    local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)*puVar10;
  }
  local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar10[1];
  *puVar10 = peVar11;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  local_68 = 0;
  local_60 = 0;
  local_70 = &local_60;
  QPDFObjectHandle::parse(local_e0,(string *)local_378,(string *)&local_398);
  QVar23.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_378;
  QVar23.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_d0;
  QPDF::makeIndirectObject(QVar23);
  if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if (local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)&local_388) {
    operator_delete(local_398.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)(local_388 + 1));
  }
  if (local_370 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_360) {
    operator_delete(local_370,local_360 + 1);
  }
  if (local_160 != local_150) {
    operator_delete(local_160,local_150[0] + 1);
  }
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300 + 1);
  }
  if (local_1f0 != (element_type *)local_1e0) {
    operator_delete(local_1f0,(ulong)(local_1e0[0] + 1));
  }
  if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,(ulong)(local_2c0 + 1));
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,local_2a0 + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
  }
  if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,(ulong)(local_280 + 1));
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  local_370 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x41;
  local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_388;
  peVar11 = (element_type *)std::__cxx11::string::_M_create((ulong *)&local_398,(ulong)&local_370);
  p_Var19 = local_370;
  local_388 = local_370;
  local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar11;
  memcpy(peVar11,"q\nBT\n  102 700 Td\n  /F1 16 Tf\n  (Here is an attachment.) Tj\nET\nQ\n",0x41);
  local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var19;
  peVar11[(long)p_Var19] = (element_type)0x0;
  QPDF::newStream((string *)&local_130);
  if (local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)&local_388) {
    operator_delete(local_398.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)(local_388 + 1));
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,0x105362);
  local_2b0 = &local_2a0;
  plVar14 = plVar7 + 2;
  if ((long *)*plVar7 == plVar14) {
    local_2a0 = *plVar14;
    lStack_298 = plVar7[3];
  }
  else {
    local_2a0 = *plVar14;
    local_2b0 = (long *)*plVar7;
  }
  local_2a8 = plVar7[1];
  *plVar7 = (long)plVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  pp_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(plVar7 + 2);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*plVar7 == pp_Var15) {
    local_2c0 = *pp_Var15;
    lStack_2b8 = plVar7[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *pp_Var15;
    local_2d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*plVar7;
  }
  local_2c8 = plVar7[1];
  *plVar7 = (long)pp_Var15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  QPDFObjectHandle::unparse_abi_cxx11_();
  p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
  if (local_2d0 != &local_2c0) {
    p_Var19 = local_2c0;
  }
  if (p_Var19 < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_288 + local_2c8)) {
    p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
    if (local_290 != &local_280) {
      p_Var19 = local_280;
    }
    if (p_Var19 < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_288 + local_2c8))
    goto LAB_00103750;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2d0);
  }
  else {
LAB_00103750:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_290);
  }
  local_310 = &local_300;
  plVar7 = puVar10 + 2;
  if ((long *)*puVar10 == plVar7) {
    local_300 = *plVar7;
    uStack_2f8 = puVar10[3];
  }
  else {
    local_300 = *plVar7;
    local_310 = (long *)*puVar10;
  }
  local_308 = puVar10[1];
  *puVar10 = plVar7;
  puVar10[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_310);
  local_2f0 = &local_2e0;
  puVar16 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar16) {
    local_2e0 = *puVar16;
    lStack_2d8 = plVar7[3];
  }
  else {
    local_2e0 = *puVar16;
    local_2f0 = (ulong *)*plVar7;
  }
  local_2e8 = plVar7[1];
  *plVar7 = (long)puVar16;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  QPDFObjectHandle::unparse_abi_cxx11_();
  uVar18 = 0xf;
  if (local_2f0 != &local_2e0) {
    uVar18 = local_2e0;
  }
  if (uVar18 < (ulong)(local_1a8 + local_2e8)) {
    uVar18 = 0xf;
    if (local_1b0 != local_1a0) {
      uVar18 = local_1a0[0];
    }
    if ((ulong)(local_1a8 + local_2e8) <= uVar18) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_2f0);
      goto LAB_001038bf;
    }
  }
  puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_1b0);
LAB_001038bf:
  local_370 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_360;
  p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(puVar10 + 2);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar10 == p_Var19) {
    local_360 = *(long *)p_Var19;
    uStack_358 = puVar10[3];
  }
  else {
    local_360 = *(long *)p_Var19;
    local_370 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar10;
  }
  local_368 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar10[1];
  *puVar10 = p_Var19;
  puVar10[1] = 0;
  *p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)0x0;
  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
  peVar11 = (element_type *)(puVar10 + 2);
  if ((element_type *)*puVar10 == peVar11) {
    local_388 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)peVar11;
    uStack_380 = puVar10[3];
    local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)&local_388;
  }
  else {
    local_388 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)peVar11;
    local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)*puVar10;
  }
  local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar10[1];
  *puVar10 = peVar11;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  local_1c8 = 0;
  local_1c0 = 0;
  local_1d0 = &local_1c0;
  QPDFObjectHandle::parse((QPDF *)&local_1f0,(string *)local_378,(string *)&local_398);
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
  }
  if (local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)&local_388) {
    operator_delete(local_398.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)(local_388 + 1));
  }
  if (local_370 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_360) {
    operator_delete(local_370,local_360 + 1);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300 + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,(ulong)(local_280 + 1));
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,(ulong)(local_2c0 + 1));
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,local_2a0 + 1);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1f0;
  local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_1e8;
  if (local_1e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_1e8 + 8) = *(int *)(local_1e8 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_1e8 + 8) = *(int *)(local_1e8 + 8) + 1;
    }
  }
  QVar24.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_398;
  QVar24.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_378;
  QPDF::addPage(QVar24,true);
  if (local_398.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_398.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  QPDFWriter::QPDFWriter((QPDFWriter *)&local_370,local_378,local_230);
  QPDFWriter::setQDFMode(SUB81(&local_370,0));
  QPDFWriter::setSuppressOriginalObjectIDs(SUB81(&local_370,0));
  QPDFWriter::setDeterministicID(SUB81(&local_370,0));
  QPDFWriter::write();
  if (local_368 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368);
  }
  if (local_1e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8);
  }
  if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
  }
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
  }
  if (local_188 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188);
  }
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
  }
  QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper
            ((QPDFEmbeddedFileDocumentHelper *)local_228);
  QPDFFileSpecObjectHelper::~QPDFFileSpecObjectHelper((QPDFFileSpecObjectHelper *)local_350);
  if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
    operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  QPDF::~QPDF(local_378);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    char const* infilename = nullptr;
    char const* password = nullptr;
    char const* attachment = nullptr;
    char const* outfilename = nullptr;
    char const* mimetype = nullptr;

    auto check_arg = [](char const* arg, std::string const& msg) {
        if (arg == nullptr) {
            usage(msg);
        }
    };

    for (int i = 1; i < argc; ++i) {
        char* arg = argv[i];
        char* next = argv[i + 1];
        if (strcmp(arg, "--infile") == 0) {
            check_arg(next, "--infile takes an argument");
            infilename = next;
            ++i;
        } else if (strcmp(arg, "--password") == 0) {
            check_arg(next, "--password takes an argument");
            password = next;
            ++i;
        } else if (strcmp(arg, "--attachment") == 0) {
            check_arg(next, "--attachment takes an argument");
            attachment = next;
            ++i;
        } else if (strcmp(arg, "--outfile") == 0) {
            check_arg(next, "--outfile takes an argument");
            outfilename = next;
            ++i;
        } else if (strcmp(arg, "--mimetype") == 0) {
            check_arg(next, "--mimetype takes an argument");
            mimetype = next;
            ++i;
        } else {
            usage("unknown argument " + std::string(arg));
        }
    }
    if (!(infilename && attachment && outfilename)) {
        usage("required arguments were not provided");
    }

    try {
        process(infilename, password, attachment, mimetype, outfilename);
    } catch (std::exception& e) {
        std::cerr << whoami << " exception: " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}